

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::Subst_LBackward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  undefined4 extraout_var_01;
  long lVar3;
  long lVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a8;
  long local_98;
  Fad<double> sum;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar4 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar4 != CONCAT44(extraout_var,iVar1)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar4 = CONCAT44(extraout_var_00,iVar1);
  while (0 < lVar4) {
    lVar2 = lVar4 + -1;
    local_98 = lVar4;
    for (lVar3 = 0; lVar4 = lVar2,
        lVar3 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol; lVar3 = lVar3 + 1) {
      sum.val_ = 0.0;
      sum.dx_.num_elts = 0;
      sum.dx_.ptr_to_data = (double *)0x0;
      sum.defaultVal = 0.0;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      lVar4 = CONCAT44(extraout_var_01,iVar1);
      while (local_98 < lVar4) {
        lVar4 = lVar4 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar2,lVar4);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(&local_70,B,lVar4,lVar3);
        local_a8.fadexpr_.left_ = &local_50;
        local_a8.fadexpr_.right_ = &local_70;
        Fad<double>::operator+=(&sum,&local_a8);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad(&local_50);
      }
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_70,B,lVar2,lVar3);
      local_a8.fadexpr_.right_ = &sum;
      local_a8.fadexpr_.left_ = &local_70;
      Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                (&local_50,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&local_a8);
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(B,lVar2,lVar3,&local_50);
      Fad<double>::~Fad(&local_50);
      Fad<double>::~Fad(&local_70);
      Fad<double>::~Fad(&sum);
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}